

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_token_scanner.c
# Opt level: O3

void FileTokenScanner_delete(TokenScanner *token_scanner)

{
  if (token_scanner != (TokenScanner *)0x0) {
    if ((FILE *)token_scanner[1].del != (FILE *)0x0) {
      fclose((FILE *)token_scanner[1].del);
    }
    Utf8Source_delete((Utf8Source *)token_scanner[2].read);
    free(token_scanner[3].read);
    free(token_scanner);
    return;
  }
  return;
}

Assistant:

static void FileTokenScanner_delete(TokenScanner* token_scanner) {
    if (!token_scanner) {
        return;
    }
    FileTokenScanner* file_token_scanner = (FileTokenScanner*)token_scanner;
    if (file_token_scanner->file)
        fclose(file_token_scanner->file);
    Utf8Source_delete(file_token_scanner->utf8_source);
    free((void*)file_token_scanner->buffer);
    free((void*)file_token_scanner);
}